

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_SimQualityTest(Gia_Man_t *p)

{
  FILE *pFile;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint local_28;
  int nMints;
  int m;
  int k;
  Vec_Int_t *vRes;
  Vec_Int_t *vPat;
  Gia_Man_t *p_local;
  
  vPat = (Vec_Int_t *)p;
  iVar1 = Gia_ManCiNum(p);
  iVar2 = Gia_ManCiNum((Gia_Man_t *)vPat);
  if (iVar2 < 0xb) {
    for (local_28 = 0; (int)local_28 < 1 << ((byte)iVar1 & 0x1f); local_28 = local_28 + 1) {
      printf("%d : ",(ulong)local_28);
      pFile = _stdout;
      iVar2 = Gia_ManCiNum((Gia_Man_t *)vPat);
      Extra_PrintBinary(pFile,&local_28,iVar2);
      printf(" ");
      iVar2 = Gia_ManCiNum((Gia_Man_t *)vPat);
      vRes = Vec_IntAlloc(iVar2);
      nMints = 0;
      while( true ) {
        iVar2 = nMints;
        iVar3 = Gia_ManCiNum((Gia_Man_t *)vPat);
        if (iVar3 <= iVar2) break;
        Vec_IntPush(vRes,(int)local_28 >> ((byte)nMints & 0x1f) & 1);
        nMints = nMints + 1;
      }
      _m = Gia_SimQualityOne((Gia_Man_t *)vPat,vRes,1);
      uVar4 = Vec_IntSum(_m);
      printf("%d ",(ulong)uVar4);
      Vec_IntFree(_m);
      Vec_IntFree(vRes);
      printf("\n");
    }
    return;
  }
  __assert_fail("Gia_ManCiNum(p) <= 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x659,"void Gia_SimQualityTest(Gia_Man_t *)");
}

Assistant:

void Gia_SimQualityTest( Gia_Man_t * p )
{
    Vec_Int_t * vPat, * vRes;
    int k, m, nMints = (1 << Gia_ManCiNum(p));
    assert( Gia_ManCiNum(p) <= 10 );
    for ( m = 0; m < nMints; m++ )
    {
        printf( "%d : ", m );
        Extra_PrintBinary( stdout, (unsigned*)&m, Gia_ManCiNum(p) );
        printf( " " );
        vPat = Vec_IntAlloc( Gia_ManCiNum(p) );
        for ( k = 0; k < Gia_ManCiNum(p); k++ )
            Vec_IntPush( vPat, (m >> k) & 1 );
        vRes = Gia_SimQualityOne( p, vPat, 1 );
        printf( "%d ", Vec_IntSum(vRes) );
        Vec_IntFree( vRes );
        Vec_IntFree( vPat );
        printf( "\n" );
    }
}